

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void terminal_overwrite(EditLine *el,wchar_t *cp,size_t n)

{
  wint_t c_00;
  wchar_t local_24;
  size_t sStack_20;
  wchar_t c;
  size_t n_local;
  wchar_t *cp_local;
  EditLine *el_local;
  
  if ((n != 0) &&
     (sStack_20 = n, n_local = (size_t)cp, cp_local = (wchar_t *)el,
     n <= (ulong)(long)(el->el_terminal).t_size.h)) {
    do {
      c_00 = *(wint_t *)n_local;
      n_local = n_local + 4;
      terminal__putc((EditLine *)cp_local,c_00);
      cp_local[0xc] = cp_local[0xc] + L'\x01';
      sStack_20 = sStack_20 - 1;
    } while (sStack_20 != 0);
    if (cp_local[0x24] <= cp_local[0xc]) {
      if ((cp_local[0x26] & 0x80U) == 0) {
        cp_local[0xc] = cp_local[0x24] + L'\xffffffff';
      }
      else {
        cp_local[0xc] = L'\0';
        if (cp_local[0xd] + L'\x01' < cp_local[0x25]) {
          cp_local[0xd] = cp_local[0xd] + L'\x01';
        }
        if ((cp_local[0x26] & 0x100U) != 0) {
          local_24 = *(wchar_t *)
                      (*(long *)(*(long *)(cp_local + 0xe) + (long)cp_local[0xd] * 8) +
                      (long)cp_local[0xc] * 4);
          if (local_24 == L'\0') {
            terminal__putc((EditLine *)cp_local,0x20);
            cp_local[0xc] = L'\x01';
          }
          else {
            terminal_overwrite((EditLine *)cp_local,&local_24,1);
            while (*(int *)(*(long *)(*(long *)(cp_local + 0xe) + (long)cp_local[0xd] * 8) +
                           (long)cp_local[0xc] * 4) == -1) {
              cp_local[0xc] = cp_local[0xc] + L'\x01';
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

libedit_private void
terminal_overwrite(EditLine *el, const wchar_t *cp, size_t n)
{
	if (n == 0)
		return;

	if (n > (size_t)el->el_terminal.t_size.h) {
#ifdef DEBUG_SCREEN
		(void) fprintf(el->el_errfile,
		    "%s: n is ridiculous: %zu\r\n", __func__, n);
#endif /* DEBUG_SCREEN */
		return;
	}

        do {
                /* terminal__putc() ignores any MB_FILL_CHARs */
                terminal__putc(el, *cp++);
                el->el_cursor.h++;
        } while (--n);

	if (el->el_cursor.h >= el->el_terminal.t_size.h) {	/* wrap? */
		if (EL_HAS_AUTO_MARGINS) {	/* yes */
			el->el_cursor.h = 0;
			if (el->el_cursor.v + 1 < el->el_terminal.t_size.v)
				el->el_cursor.v++;
			if (EL_HAS_MAGIC_MARGINS) {
				/* force the wrap to avoid the "magic"
				 * situation */
				wchar_t c;
				if ((c = el->el_display[el->el_cursor.v]
				    [el->el_cursor.h]) != '\0') {
					terminal_overwrite(el, &c, (size_t)1);
					while (el->el_display[el->el_cursor.v]
					    [el->el_cursor.h] == MB_FILL_CHAR)
						el->el_cursor.h++;
				} else {
					terminal__putc(el, ' ');
					el->el_cursor.h = 1;
				}
			}
		} else		/* no wrap, but cursor stays on screen */
			el->el_cursor.h = el->el_terminal.t_size.h - 1;
	}
}